

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cc
# Opt level: O1

void __thiscall
kratos::VarDuplicated::add_source(VarDuplicated *this,shared_ptr<kratos::AssignStmt> *stmt)

{
  StmtException *this_00;
  initializer_list<kratos::IRNode_*> __l;
  element_type *local_70;
  string local_68;
  vector<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_> local_48;
  allocator_type local_29;
  
  this_00 = (StmtException *)__cxa_allocate_exception(0x10);
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_68,"Duplicate variable cannot be on left hand side","");
  local_70 = (stmt->super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  __l._M_len = 1;
  __l._M_array = (iterator)&local_70;
  std::vector<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_>::vector(&local_48,__l,&local_29);
  StmtException::StmtException(this_00,&local_68,&local_48);
  __cxa_throw(this_00,&StmtException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void VarDuplicated::add_source(const std::shared_ptr<AssignStmt> &stmt) {
    throw StmtException("Duplicate variable cannot be on left hand side", {stmt.get()});
}